

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::
get_extra_required_extension_names_abi_cxx11_
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *__return_storage_ptr__,ShaderSubgroupSupportHelper *this,Candidate c)

{
  initializer_list<const_char_*> init;
  initializer_list<const_char_*> init_00;
  char *local_50;
  char *local_48;
  iterator local_40;
  undefined8 local_38;
  char *local_30;
  iterator local_28;
  undefined8 local_20;
  int local_14;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSStack_10;
  Candidate c_local;
  
  local_14 = (int)this;
  pSStack_10 = __return_storage_ptr__;
  if (local_14 == 7) {
    local_30 = "GL_ARB_shader_int64";
    local_28 = &local_30;
    local_20 = 1;
    init_00._M_len = 1;
    init_00._M_array = local_28;
    SmallVector<std::__cxx11::string,8ul>::SmallVector<char_const*>
              ((SmallVector<std::__cxx11::string,8ul> *)__return_storage_ptr__,init_00);
  }
  else if (local_14 == 9) {
    local_50 = "GL_AMD_gpu_shader_int64";
    local_48 = "GL_NV_gpu_shader5";
    local_40 = &local_50;
    local_38 = 2;
    init._M_len = 2;
    init._M_array = local_40;
    SmallVector<std::__cxx11::string,8ul>::SmallVector<char_const*>
              ((SmallVector<std::__cxx11::string,8ul> *)__return_storage_ptr__,init);
  }
  else {
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<std::string> CompilerGLSL::ShaderSubgroupSupportHelper::get_extra_required_extension_names(Candidate c)
{
	switch (c)
	{
	case ARB_shader_ballot:
		return { "GL_ARB_shader_int64" };
	case AMD_gcn_shader:
		return { "GL_AMD_gpu_shader_int64", "GL_NV_gpu_shader5" };
	default:
		return {};
	}
}